

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O1

c_int osqp_update_delta(OSQPWorkspace *work,c_float delta_new)

{
  c_int cVar1;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_delta");
    return cVar1;
  }
  if (0.0 < delta_new) {
    work->settings->delta = delta_new;
    return 0;
  }
  printf("ERROR in %s: ","osqp_update_delta");
  printf("delta must be positive");
  putchar(10);
  return 1;
}

Assistant:

c_int osqp_update_delta(OSQPWorkspace *work, c_float delta_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that delta is positive
  if (delta_new <= 0.) {
# ifdef PRINTING
    c_eprint("delta must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  // Update delta
  work->settings->delta = delta_new;

  return 0;
}